

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O0

int __thiscall Move::getMoveType(Move *this)

{
  bool bVar1;
  Move *this_local;
  
  if (this->tradedNurse == (NurseSolution *)0x0) {
    bVar1 = Position::positionValid(&this->lastPosition);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

int Move::getMoveType(){
    //If not nullptr, so it was a trade
    if(tradedNurse != nullptr)
        return 2;
        //if last position is not valid, then nurse was removed
    else if(!lastPosition.positionValid())
        return 1;
        //if not, nurse was added
    else return 0;
}